

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

bool getIndexed(Image *output,vector<unsigned_char,_std::allocator<unsigned_char>_> *input,Size size
               ,bool isSwitch,int colors)

{
  int iVar1;
  Color *__last;
  Color *__first;
  byte *pbVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type sVar5;
  byte in_CL;
  Size in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  Size *in_RDI;
  int in_R8D;
  byte bVar6;
  int y;
  int x;
  int i_1;
  int i;
  vector<Color,_std::allocator<Color>_> table;
  int maskStart;
  int imgStart;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Image *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  value_type vVar7;
  Image *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  vector<Color,_std::allocator<Color>_> *this;
  int local_5c;
  int local_58;
  undefined1 local_41 [25];
  int local_28;
  int local_24;
  byte local_19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  Size *local_10;
  Size local_8;
  
  local_19 = in_CL & 1;
  iVar1 = in_R8D << 2;
  local_24 = iVar1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_RDX;
  local_28 = Size::area(&local_8);
  local_28 = iVar1 + local_28;
  __last = (Color *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (local_18,0);
  __first = (Color *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (local_18,(long)local_24);
  this = (vector<Color,_std::allocator<Color>_> *)local_41;
  std::allocator<Color>::allocator((allocator<Color> *)0x1091d9);
  std::vector<Color,std::allocator<Color>>::vector<Color*,void>
            (this,__first,__last,(allocator_type *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
  std::allocator<Color>::~allocator((allocator<Color> *)0x1091fe);
  *local_10 = local_8;
  std::vector<Color,_std::allocator<Color>_>::clear
            ((vector<Color,_std::allocator<Color>_> *)0x109222);
  for (local_58 = local_24; local_58 < local_28; local_58 = local_58 + 1) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_18,(long)local_58);
    std::vector<Color,_std::allocator<Color>_>::operator[]
              ((vector<Color,_std::allocator<Color>_> *)(local_41 + 1),(ulong)*pbVar2);
    std::vector<Color,_std::allocator<Color>_>::push_back
              ((vector<Color,_std::allocator<Color>_> *)in_stack_ffffffffffffff60,
               (value_type *)
               CONCAT17(in_stack_ffffffffffffff5f,
                        CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  }
  local_5c = local_28;
  while( true ) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
    if (sVar3 <= (ulong)(long)local_5c) break;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_18,(long)local_5c);
    vVar7 = *pvVar4;
    in_stack_ffffffffffffff60 =
         (Image *)Image::pixel(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                               in_stack_ffffffffffffff48);
    *(value_type *)((long)&(in_stack_ffffffffffffff60->size).width + 3) = vVar7;
    local_5c = local_5c + 1;
  }
  if ((local_19 & 1) == 0) {
    swapBR(in_stack_ffffffffffffff60);
  }
  sVar3 = (size_type)local_28;
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
  bVar6 = sVar3 != sVar5;
  std::vector<Color,_std::allocator<Color>_>::~vector
            ((vector<Color,_std::allocator<Color>_> *)in_stack_ffffffffffffff60);
  return (bool)(bVar6 & 1);
}

Assistant:

bool getIndexed(Image &output, const std::vector<uint8_t> &input, Size size, bool isSwitch, int colors) {
	assert(input.size() >= colors * 4 + size.area());
	int imgStart = colors * 4;
	int maskStart = imgStart + size.area();
	std::vector<Color> table((Color *)&input[0], (Color *)&input[imgStart]);

	output.size = size;
	output.colorData.clear();
	for (int i = imgStart; i < maskStart; i++) {
		output.colorData.push_back(table[input[i]]);
	}
	for (int i = maskStart; i < input.size(); i++) {
		int x = (i - maskStart) % size.width;
		int y = (i - maskStart) / size.width;
		output.pixel(x, y).a = input[i];
	}

	if (!isSwitch) { swapBR(output); }
	return maskStart != input.size();
}